

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_nim_has_valid_dims(nifti_image *nim,int complain)

{
  int *piVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  
  uVar7 = nim->dim[0];
  if (uVar7 - 8 < 0xfffffff9) {
    if (complain != 0) {
      fprintf(_stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",(ulong)uVar7);
      return 0;
    }
LAB_0011a832:
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    if (nim->ndim != uVar7) {
      if (complain == 0) goto LAB_0011a832;
      fprintf(_stderr,"** NVd: ndim != dim[0] (%d,%d)\n");
      uVar4 = 1;
    }
    piVar1 = nim->dim;
    iVar2 = *piVar1;
    if ((((((0 < iVar2) && (nim->dim[1] != nim->nx)) || ((1 < iVar2 && (nim->dim[2] != nim->ny))))
         || ((2 < iVar2 && (nim->dim[3] != nim->nz)))) || ((3 < iVar2 && (nim->dim[4] != nim->nt))))
       || ((((4 < iVar2 && (nim->dim[5] != nim->nu)) || ((5 < iVar2 && (nim->dim[6] != nim->nv))))
           || ((6 < iVar2 && (nim->dim[7] != nim->nw)))))) {
      if (complain == 0) goto LAB_0011a832;
      nifti_nim_has_valid_dims_cold_1();
      uVar4 = (uint)((ulong)in_RAX >> 0x20);
    }
    if (2 < g_opts_0) {
      nifti_nim_has_valid_dims_cold_2();
    }
    uVar3 = (ulong)(uint)*piVar1;
    uVar5 = 1;
    if (0 < *piVar1) {
      lVar6 = 0;
      do {
        if ((long)nim->dim[lVar6 + 1] < 1) {
          if (complain == 0) goto LAB_0011a832;
          fprintf(_stderr,"** NVd: dim[%d] (=%d) <= 0\n",(ulong)((int)lVar6 + 1));
          uVar4 = uVar4 + 1;
        }
        else {
          uVar5 = uVar5 * (long)nim->dim[lVar6 + 1];
        }
        uVar3 = (ulong)*piVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < (long)uVar3);
    }
    if (uVar5 != nim->nvox) {
      if (complain == 0) goto LAB_0011a832;
      fprintf(_stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",uVar3,nim->nvox,
              uVar5 & 0xffffffff);
      uVar4 = uVar4 + 1;
    }
    if (1 < g_opts_0) {
      uVar7 = *piVar1;
      lVar6 = (long)(int)uVar7;
      if (lVar6 < 7) {
        do {
          uVar7 = uVar7 + 1;
          if (1 < (uint)nim->dim[lVar6 + 1]) {
            fprintf(_stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",(ulong)uVar7,
                    (ulong)(uint)nim->dim[lVar6 + 1],(ulong)(uint)*piVar1);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 7);
      }
    }
    if (2 < g_opts_0) {
      fprintf(_stderr,"-d nim_has_valid_dims check, errs = %d\n",(ulong)uVar4);
    }
    uVar7 = (uint)((int)uVar4 < 1);
  }
  return uVar7;
}

Assistant:

int nifti_nim_has_valid_dims(nifti_image * nim, int complain)
{
   size_t prod;
   int    c, errs = 0;

   /**- start with dim[0]: failure here is considered terminal */
   if( nim->dim[0] <= 0 || nim->dim[0] > 7 ){
      errs++;
      if( complain )
         fprintf(stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",nim->dim[0]);
      return 0;
   }

   /**- check whether ndim equals dim[0] */
   if( nim->ndim != nim->dim[0] ){
      errs++;
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: ndim != dim[0] (%d,%d)\n",nim->ndim,nim->dim[0]);
   }

   /**- compare each dim[i] to the proper nx, ny, ... */
   if( ( (nim->dim[0] >= 1) && (nim->dim[1] != nim->nx) ) ||
       ( (nim->dim[0] >= 2) && (nim->dim[2] != nim->ny) ) ||
       ( (nim->dim[0] >= 3) && (nim->dim[3] != nim->nz) ) ||
       ( (nim->dim[0] >= 4) && (nim->dim[4] != nim->nt) ) ||
       ( (nim->dim[0] >= 5) && (nim->dim[5] != nim->nu) ) ||
       ( (nim->dim[0] >= 6) && (nim->dim[6] != nim->nv) ) ||
       ( (nim->dim[0] >= 7) && (nim->dim[7] != nim->nw) )   ){
      errs++;
      if( !complain ) return 0;
      fprintf(stderr,"** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n"
                     "                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n",
                     nim->dim[1], nim->dim[2], nim->dim[3],
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7],
                     nim->nx, nim->ny, nim->nz,
                     nim->nt, nim->nu, nim->nv, nim->nw );
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d check dim[%d] =", nim->dim[0]);
      for( c = 0; c < 7; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /**- check the dimensions, and that their product matches nvox */
   prod = 1;
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( nim->dim[c] > 0)
         prod *= nim->dim[c];
      else if( nim->dim[c] <= 0 ){
         if( !complain ) return 0;
         fprintf(stderr,"** NVd: dim[%d] (=%d) <= 0\n",c, nim->dim[c]);
         errs++;
      }
   }
   if( prod != nim->nvox ){
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",
              nim->dim[0], (unsigned)nim->nvox, (unsigned)prod);
      errs++;
   }

   /**- if debug, warn about any remaining dim that is neither 0, nor 1 */
   /*   (values in dims above dim[0] are undefined, as reminded by Cinly
         Ooi and Alle Meije Wink)                   16 Nov 2005 [rickr] */
   if( g_opts.debug > 1 )
      for( c = nim->dim[0]+1; c <= 7; c++ )
         if( nim->dim[c] != 0 && nim->dim[c] != 1 )
            fprintf(stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",
                    c, nim->dim[c], nim->dim[0]);

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d nim_has_valid_dims check, errs = %d\n", errs);

   /**- return invalid or valid */
   if( errs > 0 ) return 0;
   else           return 1;
}